

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

void __thiscall evaluator::Evaluator::~Evaluator(Evaluator *this)

{
  Object *pOVar1;
  Evaluator *this_local;
  
  pOVar1 = GCPtr::operator_cast_to_Object_((GCPtr *)&NATIVE_TRUE);
  if (pOVar1 != (Object *)0x0) {
    (*pOVar1->_vptr_Object[2])();
  }
  pOVar1 = GCPtr::operator_cast_to_Object_((GCPtr *)&NATIVE_FALSE);
  if (pOVar1 != (Object *)0x0) {
    (*pOVar1->_vptr_Object[2])();
  }
  pOVar1 = GCPtr::operator_cast_to_Object_((GCPtr *)&NATIVE_NULL);
  if (pOVar1 != (Object *)0x0) {
    (*pOVar1->_vptr_Object[2])();
  }
  return;
}

Assistant:

Evaluator::~Evaluator()
{
    delete NATIVE_TRUE;
    delete NATIVE_FALSE;
    delete NATIVE_NULL;
}